

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  WhereInfo *pWVar4;
  WhereClause *pWVar5;
  WhereLoop *pTemplate;
  WhereTerm *pWVar6;
  SrcList *pSVar7;
  WhereOrInfo *pWVar8;
  ulong uVar9;
  ulong uVar10;
  u16 uVar11;
  LogEst rRun;
  LogEst nOut;
  int iVar12;
  WhereTerm *pWVar13;
  WhereTerm *pWVar14;
  WhereTerm *pWVar15;
  ulong uVar16;
  LogEst *pLVar17;
  long in_FS_OFFSET;
  bool bVar18;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sPrev;
  WhereOrSet sCur;
  WhereOrSet sSum;
  WhereClause tempWC;
  ulong local_370;
  undefined1 local_308 [48];
  ushort local_2d8;
  undefined2 uStack_2d6;
  undefined4 uStack_2d4;
  undefined8 uStack_2d0;
  LogEst local_2c8 [16];
  undefined1 *local_2a8;
  undefined1 *local_298;
  undefined1 *puStack_290;
  undefined8 local_288;
  undefined1 *puStack_280;
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined1 *local_268;
  WhereOrSet local_258;
  WhereInfo *local_220;
  WhereClause *local_218;
  undefined1 local_210;
  undefined4 local_20c;
  undefined4 local_204;
  WhereTerm *local_200;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar4 = pBuilder->pWInfo;
  memset(&local_220,0xaa,0x1e8);
  local_308._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_308._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_268 = &DAT_aaaaaaaaaaaaaaaa;
  local_278 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
  local_288 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_280 = &DAT_aaaaaaaaaaaaaaaa;
  local_298 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_290 = &DAT_aaaaaaaaaaaaaaaa;
  pWVar5 = pBuilder->pWC;
  pTemplate = pBuilder->pNew;
  iVar2 = pWVar5->nTerm;
  pWVar6 = pWVar5->a;
  local_258.a[1].rRun = 0;
  local_258.a[1].nOut = 0;
  local_258.a[1]._12_4_ = 0;
  local_258.a[2].prereq = 0;
  local_258.a[0].rRun = 0;
  local_258.a[0].nOut = 0;
  local_258.a[0]._12_4_ = 0;
  local_258.a[1].prereq = 0;
  local_258._0_8_ = 0;
  local_258.a[0].prereq = 0;
  local_258.a[2].rRun = 0;
  local_258.a[2].nOut = 0;
  local_258.a[2]._12_4_ = 0;
  pSVar7 = pWVar4->pTabList;
  bVar1 = pTemplate->iTab;
  iVar12 = 0;
  if (((pSVar7->a[bVar1].fg.jointype & 0x10) == 0) &&
     (pWVar15 = pWVar5->a, pWVar15 < pWVar6 + iVar2)) {
    iVar3 = pSVar7->a[bVar1].iCursor;
    do {
      iVar12 = 0;
      if (((pWVar15->eOperator & 0x200) != 0) &&
         (pWVar8 = (pWVar15->u).pOrInfo, (pWVar8->indexable & pTemplate->maskSelf) != 0)) {
        pWVar14 = (pWVar8->wc).a + (pWVar8->wc).nTerm;
        local_308._0_8_ = pBuilder->pWInfo;
        local_308._8_8_ = pBuilder->pWC;
        local_308._16_8_ = pBuilder->pNew;
        local_308._32_8_ = *(undefined8 *)&pBuilder->bldFlags1;
        local_308._24_8_ = &local_298;
        pWVar13 = (pWVar8->wc).a;
        iVar12 = 0;
        if (pWVar13 < pWVar14) {
          iVar12 = 0;
          bVar18 = true;
          do {
            if ((pWVar13->eOperator & 0x400) == 0) {
              if (pWVar13->leftCursor == iVar3) {
                local_220 = pWVar5->pWInfo;
                local_210 = 0x2c;
                local_20c = 1;
                local_204 = 1;
                local_308._8_8_ = &local_220;
                local_218 = pWVar5;
                local_200 = pWVar13;
                goto LAB_0019ca09;
              }
            }
            else {
              local_308._8_8_ = pWVar13->u;
LAB_0019ca09:
              local_298 = (undefined1 *)((ulong)local_298 & 0xffffffffffff0000);
              if ((pSVar7->a[bVar1].pSTab)->eTabType == '\x01') {
                iVar12 = whereLoopAddVirtual((WhereLoopBuilder *)local_308,mPrereq,mUnusable);
              }
              else {
                iVar12 = whereLoopAddBtree((WhereLoopBuilder *)local_308,mPrereq);
              }
              if (iVar12 == 0) {
                iVar12 = whereLoopAddOr((WhereLoopBuilder *)local_308,mPrereq,mUnusable);
              }
              if ((short)local_298 == 0) {
                local_258._0_8_ = (ulong)(uint6)local_258._2_6_ << 0x10;
                break;
              }
              if (bVar18) {
                local_258.n = (short)local_298;
                __memcpy_chk(local_258.a,&puStack_290,((ulong)local_298 & 0xffff) << 4,0x30);
              }
              else {
                uStack_2d4 = 0xaaaaaaaa;
                uStack_2d0._0_4_ = 0xaaaaaaaa;
                uStack_2d0._4_4_ = 0xaaaaaaaa;
                local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
                local_2c8[8] = -0x5556;
                local_2c8[9] = -0x5556;
                local_2c8[10] = -0x5556;
                local_2c8[0xb] = -0x5556;
                local_2c8[0xc] = -0x5556;
                local_2c8[0xd] = -0x5556;
                local_2c8[0xe] = -0x5556;
                local_2c8[0xf] = -0x5556;
                local_2c8[0] = -0x5556;
                local_2c8[1] = -0x5556;
                local_2c8[2] = -0x5556;
                local_2c8[3] = -0x5556;
                local_2c8[4] = -0x5556;
                local_2c8[5] = -0x5556;
                local_2c8[6] = -0x5556;
                local_2c8[7] = -0x5556;
                uVar11 = local_258.n;
                _local_2d8 = CONCAT22(0xaaaa,local_258.n);
                __memcpy_chk(&uStack_2d0,local_258.a,(local_258._0_8_ & 0xffff) << 4,0x30);
                local_258._0_8_ = local_258._0_8_ & 0xffffffffffff0000;
                if (uVar11 != 0) {
                  local_370 = 0;
                  do {
                    if ((short)local_298 != 0) {
                      pLVar17 = (LogEst *)((long)&local_288 + 2);
                      uVar16 = 0;
                      do {
                        uVar9 = *(ulong *)(pLVar17 + -5);
                        uVar10 = (&uStack_2d0)[local_370 * 2];
                        rRun = sqlite3LogEstAdd(local_2c8[local_370 * 8],pLVar17[-1]);
                        nOut = sqlite3LogEstAdd(local_2c8[local_370 * 8 + 1],*pLVar17);
                        whereOrInsert(&local_258,uVar9 | uVar10,rRun,nOut);
                        uVar16 = uVar16 + 1;
                        pLVar17 = pLVar17 + 8;
                      } while (uVar16 < ((ulong)local_298 & 0xffff));
                    }
                    local_370 = local_370 + 1;
                  } while (local_370 < local_2d8);
                }
              }
              bVar18 = false;
            }
            pWVar13 = pWVar13 + 1;
          } while (pWVar13 < pWVar14);
        }
        pTemplate->nLTerm = 1;
        *pTemplate->aLTerm = pWVar15;
        pTemplate->wsFlags = 0x2000;
        pTemplate->rSetup = 0;
        pTemplate->iSortIdx = '\0';
        *(undefined8 *)&pTemplate->u = 0;
        (pTemplate->u).btree.pIndex = (Index *)0x0;
        (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
        if ((iVar12 == 0) && (local_258.n != 0)) {
          pLVar17 = &local_258.a[0].nOut;
          uVar16 = 1;
          do {
            pTemplate->rRun = (short)*(undefined4 *)(pLVar17 + -1) + 1;
            pTemplate->nOut = *pLVar17;
            pTemplate->prereq = ((WhereOrCost *)(pLVar17 + -5))->prereq;
            iVar12 = whereLoopInsert(pBuilder,pTemplate);
            if (iVar12 != 0) break;
            pLVar17 = pLVar17 + 8;
            bVar18 = uVar16 < (local_258._0_8_ & 0xffff);
            uVar16 = uVar16 + 1;
          } while (bVar18);
        }
      }
      pWVar15 = pWVar15 + 1;
    } while ((pWVar15 < pWVar6 + iVar2) && (iVar12 == 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar12;
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  SrcItem *pItem;

  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  /* The multi-index OR optimization does not work for RIGHT and FULL JOIN */
  if( pItem->fg.jointype & JT_RIGHT ) return SQLITE_OK;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;

      sSubBuild = *pBuilder;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x400, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.nBase = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x400, ("OR-term %d of %p has %d subterms:\n",
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x20000 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pSTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        testcase( rc==SQLITE_NOMEM && sCur.n>0 );
        testcase( rc==SQLITE_DONE );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty
        ** (equivalent to multiplying the cost by 1.07) to ensure that
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x400, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}